

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O1

bool __thiscall stk::FileRead::getMatInfo(FileRead *this,char *fileName)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  StkFormat SVar6;
  unsigned_long uVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  ostream *poVar11;
  char cVar12;
  float fVar13;
  char rate;
  SINT32 namesize;
  char mi [2];
  UINT32 type;
  char name [3];
  SINT32 nametype;
  SINT32 columns;
  SINT32 rows;
  SINT32 chunkSize;
  char head [5];
  byte local_98;
  undefined1 uStack_97;
  undefined2 uStack_96;
  undefined4 uStack_94;
  int local_8c;
  double local_88;
  short local_7e;
  uint local_7c;
  uint local_78;
  short local_73;
  undefined1 local_71;
  int local_70;
  int local_6c;
  uint local_68;
  int local_64;
  char local_5d [4];
  undefined1 local_59;
  StkFormat local_58;
  StkFormat local_50;
  StkFormat local_48;
  StkFormat local_40;
  StkFormat local_38;
  
  iVar3 = fseek((FILE *)this->fd_,0,0);
  if ((iVar3 != -1) && (sVar4 = fread(local_5d,4,1,(FILE *)this->fd_), sVar4 == 1)) {
    local_59 = 0;
    pcVar5 = strchr(local_5d,0x30);
    if (pcVar5 != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&Stk::oStream__abi_cxx11_,"FileRead: ",10);
      if (fileName == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(Stk::oStream__abi_cxx11_ + -0x18) + 0x1173a0);
      }
      else {
        sVar4 = strlen(fileName);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&Stk::oStream__abi_cxx11_,fileName,sVar4);
      }
      poVar11 = (ostream *)&Stk::oStream__abi_cxx11_;
      pcVar5 = " appears to be a Version 4 MAT-file, which is not currently supported.";
      lVar9 = 0x46;
      goto LAB_0010dbe4;
    }
    this->byteswap_ = false;
    iVar3 = fseek((FILE *)this->fd_,0x7e,0);
    if ((iVar3 != -1) && (sVar4 = fread(&local_7e,2,1,(FILE *)this->fd_), sVar4 == 1)) {
      if (local_7e == 0x494d) {
        this->byteswap_ = true;
      }
      else if (local_7e != 0x4d49) goto LAB_0010db7d;
      local_38 = 0x20;
      local_40 = 0x10;
      local_48 = 8;
      local_50 = 2;
      local_58 = 1;
      local_7c = 0;
      bVar1 = false;
      bVar10 = false;
      while( true ) {
        lVar9 = ftell((FILE *)this->fd_);
        bVar2 = findNextMatArray(this,&local_64,(SINT32 *)&local_68,&local_6c,&local_70);
        if (!bVar2) break;
        if ((local_6c == 1 & local_68 == 1 & ~(byte)local_7c) != 1) {
          if (bVar1) goto LAB_0010dfea;
          if ((int)local_68 < local_6c) {
            this->channels_ = local_68;
            this->fileSize_ = (long)local_6c;
            local_98 = 4;
            uStack_97 = 0;
            uStack_96 = 0;
            if (local_70 == 1) {
              sVar4 = fread(&local_98,4,1,(FILE *)this->fd_);
              cVar12 = '\x02';
              if (sVar4 == 1) {
                if (this->byteswap_ == true) {
                  Stk::swap32(&local_98);
                }
                fVar13 = ceilf((float)CONCAT22(uStack_96,CONCAT11(uStack_97,local_98)) * 0.125);
                iVar3 = (int)fVar13;
                local_98 = (byte)iVar3;
                uStack_97 = (undefined1)((uint)iVar3 >> 8);
                uStack_96 = (undefined2)((uint)iVar3 >> 0x10);
                iVar3 = fseek((FILE *)this->fd_,(long)(iVar3 << 3),1);
                if (iVar3 != -1) goto LAB_0010de40;
              }
            }
            else {
              iVar3 = fseek((FILE *)this->fd_,4,1);
              if (iVar3 == -1) {
                cVar12 = '\x02';
              }
              else {
LAB_0010de40:
                sVar4 = fread(&local_8c,4,1,(FILE *)this->fd_);
                cVar12 = '\x02';
                if (sVar4 == 1) {
                  if (this->byteswap_ == true) {
                    Stk::swap32((uchar *)&local_8c);
                  }
                  switch(local_8c) {
                  case 1:
                    SVar6 = local_58;
                    break;
                  default:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&Stk::oStream__abi_cxx11_,
                               "FileRead: The MAT-file array data format (",0x2a);
                    poVar11 = (ostream *)
                              std::ostream::operator<<
                                        ((ostream *)&Stk::oStream__abi_cxx11_,local_8c);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,") is not supported.",0x13);
                    cVar12 = '\x01';
                    goto LAB_0010dfe1;
                  case 3:
                    SVar6 = local_50;
                    break;
                  case 5:
                    SVar6 = local_48;
                    break;
                  case 7:
                    SVar6 = local_40;
                    break;
                  case 9:
                    SVar6 = local_38;
                  }
                  this->dataType_ = SVar6;
                  iVar3 = fseek((FILE *)this->fd_,4,1);
                  if (iVar3 != -1) {
                    uVar7 = ftell((FILE *)this->fd_);
                    this->dataOffset_ = uVar7;
                    bVar1 = true;
                    cVar12 = '\0';
                  }
                }
              }
            }
LAB_0010dfe1:
            if (cVar12 == '\0') goto LAB_0010dfea;
            goto LAB_0010e32e;
          }
          poVar11 = (ostream *)&Stk::oStream__abi_cxx11_;
          pcVar5 = 
          "FileRead: Transpose the MAT-file array so that audio channels fill matrix rows (not columns)."
          ;
          lVar9 = 0x5d;
          goto LAB_0010dbe4;
        }
        local_8c = 4;
        if (local_70 == 1) {
          sVar4 = fread(&local_8c,4,1,(FILE *)this->fd_);
          cVar12 = '\x02';
          if (sVar4 == 1) {
            if (this->byteswap_ == true) {
              Stk::swap32((uchar *)&local_8c);
            }
            cVar12 = '\x05';
            if (local_8c == 2) {
              local_8c = 8;
              goto LAB_0010dd45;
            }
          }
          goto switchD_0010e05f_caseD_8;
        }
LAB_0010dd45:
        local_71 = 0;
        sVar4 = fread(&local_73,2,1,(FILE *)this->fd_);
        cVar12 = '\x02';
        if (sVar4 != 1) goto switchD_0010e05f_caseD_8;
        if (local_73 != 0x7366) {
          cVar12 = '\x05';
          goto switchD_0010e05f_caseD_8;
        }
        iVar3 = fseek((FILE *)this->fd_,(long)local_8c + -2,1);
        if (iVar3 == -1) goto switchD_0010e05f_caseD_8;
        sVar4 = fread(&local_78,4,1,(FILE *)this->fd_);
        cVar12 = '\x02';
        if (sVar4 != 1) goto switchD_0010e05f_caseD_8;
        if (this->byteswap_ == true) {
          Stk::swap32((uchar *)&local_78);
        }
        if (local_78 < 0x10000) {
          iVar3 = fseek((FILE *)this->fd_,4,1);
          cVar12 = '\x02';
          if (iVar3 == -1) goto switchD_0010e05f_caseD_8;
        }
        else {
          local_78 = local_78 & 0xffff;
        }
        cVar12 = '\x05';
        switch(local_78) {
        case 1:
          sVar4 = fread(&local_98,1,1,(FILE *)this->fd_);
          cVar12 = (sVar4 != 1) * '\x02';
          bVar2 = sVar4 == 1;
          if (bVar2) {
            sVar4 = (size_t)(uint)(int)(char)local_98;
            goto LAB_0010e2d3;
          }
LAB_0010e117:
          if (!bVar2) goto switchD_0010e05f_caseD_8;
          goto LAB_0010e2ad;
        case 2:
          sVar4 = fread(&local_98,1,1,(FILE *)this->fd_);
          cVar12 = (sVar4 != 1) * '\x02';
          bVar2 = sVar4 == 1;
          if (!bVar2) goto LAB_0010e117;
          sVar4 = (size_t)local_98;
LAB_0010e2d3:
          local_88 = (double)(int)sVar4;
          if (bVar2) goto LAB_0010e2ad;
          goto switchD_0010e05f_caseD_8;
        case 3:
          sVar4 = fread(&local_98,2,1,(FILE *)this->fd_);
          cVar12 = '\x02';
          if (sVar4 == 1) {
            if (this->byteswap_ == true) {
              Stk::swap16(&local_98);
            }
            uVar8 = (uint)CONCAT11(uStack_97,local_98);
LAB_0010e24f:
            local_88 = (double)(int)uVar8;
LAB_0010e256:
            cVar12 = '\0';
          }
          break;
        case 4:
          sVar4 = fread(&local_98,2,1,(FILE *)this->fd_);
          cVar12 = '\x02';
          if (sVar4 == 1) {
            if (this->byteswap_ == true) {
              Stk::swap16(&local_98);
            }
            uVar8 = (uint)CONCAT11(uStack_97,local_98);
            goto LAB_0010e24f;
          }
          break;
        case 5:
          sVar4 = fread(&local_98,4,1,(FILE *)this->fd_);
          cVar12 = '\x02';
          if (sVar4 == 1) {
            if (this->byteswap_ == true) {
              Stk::swap32(&local_98);
            }
            cVar12 = '\0';
            local_88 = (double)CONCAT22(uStack_96,CONCAT11(uStack_97,local_98));
          }
          break;
        case 6:
          sVar4 = fread(&local_98,4,1,(FILE *)this->fd_);
          cVar12 = '\x02';
          if (sVar4 == 1) {
            if (this->byteswap_ == true) {
              Stk::swap32(&local_98);
            }
            local_88 = (double)CONCAT22(uStack_96,CONCAT11(uStack_97,local_98));
            goto LAB_0010e256;
          }
          break;
        case 7:
          sVar4 = fread(&local_98,4,1,(FILE *)this->fd_);
          cVar12 = '\x02';
          if (sVar4 == 1) {
            if (this->byteswap_ == true) {
              Stk::swap32(&local_98);
            }
            cVar12 = '\0';
            local_88 = (double)(float)CONCAT22(uStack_96,CONCAT11(uStack_97,local_98));
          }
          break;
        default:
          goto switchD_0010e05f_caseD_8;
        case 9:
          sVar4 = fread(&local_98,8,1,(FILE *)this->fd_);
          cVar12 = '\x02';
          if (sVar4 == 1) {
            if (this->byteswap_ == true) {
              Stk::swap64(&local_98);
            }
            cVar12 = '\0';
            local_88 = (double)CONCAT44(uStack_94,CONCAT22(uStack_96,CONCAT11(uStack_97,local_98)));
          }
        }
        if (sVar4 == 1) {
LAB_0010e2ad:
          local_7c = (uint)CONCAT71((int7)(sVar4 >> 8),1);
          cVar12 = '\0';
          if (0.0 < local_88) {
            this->fileRate_ = local_88;
          }
        }
switchD_0010e05f_caseD_8:
        if ((cVar12 != '\0') && (cVar12 != '\x05')) {
LAB_0010e32e:
          if (cVar12 != '\x02') {
            return false;
          }
          goto LAB_0010db7d;
        }
LAB_0010dfea:
        if (((!bVar1) || (bVar2 = true, (local_7c & 1) == 0)) &&
           (iVar3 = fseek((FILE *)this->fd_,lVar9 + local_64 + 8,0), bVar2 = bVar10, iVar3 == -1))
        goto LAB_0010db7d;
        bVar10 = bVar2;
        if (bVar2) {
          return true;
        }
      }
      if (bVar1) {
        if ((local_7c & 1) == 0) {
          this->fileRate_ = 44100.0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&Stk::oStream__abi_cxx11_,
                     "FileRead: No sample rate found ... assuming 44100.0",0x33);
          Stk::handleError(&this->super_Stk,WARNING);
          return true;
        }
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&Stk::oStream__abi_cxx11_,"FileRead: No audio data found in MAT-file (",
                 0x2b);
      poVar11 = std::operator<<((ostream *)&Stk::oStream__abi_cxx11_,fileName);
      pcVar5 = ").";
      lVar9 = 2;
      goto LAB_0010dbe4;
    }
  }
LAB_0010db7d:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&Stk::oStream__abi_cxx11_,"FileRead: Error reading MAT-file (",0x22);
  if (fileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(Stk::oStream__abi_cxx11_ + -0x18) + 0x1173a0);
  }
  else {
    sVar4 = strlen(fileName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,fileName,sVar4);
  }
  poVar11 = (ostream *)&Stk::oStream__abi_cxx11_;
  pcVar5 = ") header.";
  lVar9 = 9;
LAB_0010dbe4:
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar5,lVar9);
  return false;
}

Assistant:

bool FileRead :: getMatInfo( const char *fileName )
{
  // MAT-file formatting information is available at:
  // http://www.mathworks.com/access/helpdesk/help/pdf_doc/matlab/matfile_format.pdf

  // Verify this is a version 5 MAT-file format.
  char head[5];
  if ( fseek(fd_, 0, SEEK_SET) == -1 ) goto error;
  if ( fread(&head, 4, 1, fd_) != 1 ) goto error;
  // If any of the first 4 characters of the header = 0, then this is
  // a Version 4 MAT-file.
  head[4] = '\0';
  if ( strstr(head, "0") ) {
    oStream_ << "FileRead: " << fileName << " appears to be a Version 4 MAT-file, which is not currently supported.";
    return false;
  }

  // Determine the endian-ness of the file.
  char mi[2];
  byteswap_ = false;
  // Locate "M" and "I" characters in header.
  if ( fseek(fd_, 126, SEEK_SET) == -1 ) goto error;
  if ( fread(&mi, 2, 1, fd_) != 1) goto error;
#ifdef __LITTLE_ENDIAN__
  if ( !strncmp(mi, "MI", 2) )
    byteswap_ = true;
  else if ( strncmp(mi, "IM", 2) ) goto error;
#else
  if ( !strncmp(mi, "IM", 2))
    byteswap_ = true;
  else if ( strncmp(mi, "MI", 2) ) goto error;
#endif

  // We are expecting a data element containing the audio data and an
  // optional data element containing the sample rate (with an array
  // name of "fs").  Both elements should be stored as a Matlab array
  // type (14).

  bool doneParsing, haveData, haveSampleRate;
  SINT32 chunkSize, rows, columns, nametype;
  long dataoffset;
  doneParsing = false;
  haveData = false;
  haveSampleRate = false;
  while ( !doneParsing ) {

    dataoffset = ftell( fd_ ); // save location in file
    if ( findNextMatArray( &chunkSize, &rows, &columns, &nametype ) == false ) {
      // No more Matlab array type chunks found.
      if ( !haveData ) {
        oStream_ << "FileRead: No audio data found in MAT-file (" << fileName << ").";
        return false;
      }
      else if ( !haveSampleRate ) {
        fileRate_ = 44100.0;
        oStream_ << "FileRead: No sample rate found ... assuming 44100.0";
        handleError( StkError::WARNING );
        return true;
      }
      else return true;
    }

    if ( !haveSampleRate && rows == 1 && columns == 1 ) { // Parse for sample rate.

      SINT32 namesize = 4;
      if ( nametype == 1 ) { // array name > 4 characters
        if ( fread(&namesize, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&namesize);
        if ( namesize != 2 ) goto tryagain; // expecting name = "fs"
        namesize = 8; // field must be padded to multiple of 8 bytes
      }
      char name[3]; name[2] = '\0';
      if ( fread(&name, 2, 1, fd_) != 1) goto error;
      if ( strncmp(name, "fs", 2) ) goto tryagain;

      // Jump to real part data subelement, which is likely to be in a
      // small data format.
      if ( fseek(fd_, namesize-2, SEEK_CUR) == -1 ) goto error;
      UINT32 type;
      StkFloat srate;
      if ( fread(&type, 4, 1, fd_) != 1 ) goto error;
      if ( byteswap_ ) swap32((unsigned char *)&type);
      if ( (type & 0xffff0000) != 0 ) // small data format
        type = (type & 0x0000ffff);
      else
        if ( fseek(fd_, 4, SEEK_CUR) == -1 ) goto error;
      if ( type == 1 ) { // SINT8
        signed char rate;
        if ( fread(&rate, 1, 1, fd_) != 1 ) goto error;
        srate = (StkFloat) rate;
      }
      else if ( type == 2 ) { // UINT8
        unsigned char rate;
        if ( fread(&rate, 1, 1, fd_) != 1 ) goto error;
        srate = (StkFloat) rate;
      }
      else if ( type == 3 ) { // SINT16
        SINT16 rate;
        if ( fread(&rate, 2, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap16((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 4 ) { // UINT16
        UINT16 rate;
        if ( fread(&rate, 2, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap16((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 5 ) { // SINT32
        SINT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 6 ) { // UINT32
        UINT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 7 ) { // FLOAT32
        FLOAT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 9 ) { // FLOAT64
        FLOAT64 rate;
        if ( fread(&rate, 8, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap64((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else
        goto tryagain;

      if ( srate > 0 ) fileRate_ = srate;
      haveSampleRate = true;
    }
    else if ( !haveData ) { // Parse for data.

      // Assume channels = smaller of rows or columns.
      if ( rows < columns ) {
        channels_ = rows;
        fileSize_ = columns;
      }
      else {
        oStream_ << "FileRead: Transpose the MAT-file array so that audio channels fill matrix rows (not columns).";
        return false;
      }

      SINT32 namesize = 4;
      if ( nametype == 1 ) { // array name > 4 characters
        if ( fread(&namesize, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&namesize);
        namesize = (SINT32) ceil((float)namesize / 8);
        if ( fseek( fd_, namesize*8, SEEK_CUR) == -1 ) goto error;  // jump over array name
      }
      else {
        if ( fseek( fd_, 4, SEEK_CUR ) == -1 ) goto error;
      }

      // Now at real part data subelement
      SINT32 type;
      if ( fread(&type, 4, 1, fd_) != 1 ) goto error;
      if ( byteswap_ ) swap32((unsigned char *)&type);
      if ( type == 1 )  dataType_ = STK_SINT8;
      else if ( type == 3 ) dataType_ = STK_SINT16;
      else if ( type == 5 ) dataType_ = STK_SINT32;
      else if ( type == 7 ) dataType_ = STK_FLOAT32;
      else if ( type == 9 ) dataType_ = STK_FLOAT64;
      else {
        oStream_ << "FileRead: The MAT-file array data format (" << type << ") is not supported.";
        return false;
      }

      // Jump to the data.
      if ( fseek(fd_, 4, SEEK_CUR) == -1 ) goto error;
      dataOffset_ = ftell(fd_);
      haveData = true;
    }

  tryagain:
    if ( haveData && haveSampleRate ) doneParsing = true;
    else // jump to end of data element and keep trying
      if ( fseek( fd_, dataoffset+chunkSize+8, SEEK_SET) == -1 ) goto error;
  }

  return true;

 error:
  oStream_ << "FileRead: Error reading MAT-file (" << fileName << ") header.";
  return false;
}